

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.c
# Opt level: O0

CURLcode Curl_headers_init(Curl_easy *data)

{
  CURLcode CVar1;
  Curl_cwriter *pCVar2;
  Curl_cwriter *pCStack_20;
  CURLcode result;
  Curl_cwriter *writer;
  Curl_easy *data_local;
  
  if ((data->conn != (connectdata *)0x0) && ((data->conn->handler->protocol & 0xc0000003) != 0)) {
    writer = (Curl_cwriter *)data;
    pCVar2 = Curl_cwriter_get_by_name(data,"hds-collect");
    if (pCVar2 != (Curl_cwriter *)0x0) {
      return CURLE_OK;
    }
    CVar1 = Curl_cwriter_create(&stack0xffffffffffffffe0,(Curl_easy *)writer,&hds_cw_collect,
                                CURL_CW_PROTOCOL);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    CVar1 = Curl_cwriter_add((Curl_easy *)writer,pCStack_20);
    if (CVar1 != CURLE_OK) {
      Curl_cwriter_free((Curl_easy *)writer,pCStack_20);
      return CVar1;
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_headers_init(struct Curl_easy *data)
{
  struct Curl_cwriter *writer;
  CURLcode result;

  if(data->conn && (data->conn->handler->protocol & PROTO_FAMILY_HTTP)) {
    /* avoid installing it twice */
    if(Curl_cwriter_get_by_name(data, hds_cw_collect.name))
      return CURLE_OK;

    result = Curl_cwriter_create(&writer, data, &hds_cw_collect,
                                 CURL_CW_PROTOCOL);
    if(result)
      return result;

    result = Curl_cwriter_add(data, writer);
    if(result) {
      Curl_cwriter_free(data, writer);
      return result;
    }
  }
  return CURLE_OK;
}